

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::CLIntercept(CLIntercept *this,void *pGlobalData)

{
  uint64_t uVar1;
  mapped_type *__dest;
  uint64_t *in_RDI;
  memory_order __b;
  CEnumNameMap *in_stack_00009a80;
  void *in_stack_fffffffffffff748;
  CChromeTracer *in_stack_fffffffffffff750;
  uint64_t *puVar2;
  key_type *__k;
  map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
  *this_00;
  undefined1 local_6f8 [528];
  undefined1 local_4e8 [1224];
  uint64_t local_20;
  memory_order local_18;
  int local_14;
  uint64_t local_10;
  uint64_t *local_8;
  
  std::mutex::mutex((mutex *)0x1d3cd0);
  ::OS::Services::Services((Services *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::
  map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
  ::map((map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
         *)0x1d3d0d);
  CEnumNameMap::CEnumNameMap(in_stack_00009a80);
  CObjectTracker::CObjectTracker((CObjectTracker *)in_stack_fffffffffffff750);
  std::ofstream::ofstream(in_RDI + 0x183);
  CChromeTracer::CChromeTracer(in_stack_fffffffffffff750);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff750);
  std::
  map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::map((map<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
         *)0x1d3daf);
  std::
  map<_cl_device_id_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>_>_>
  ::map((map<_cl_device_id_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>_>_>
         *)0x1d3dcb);
  std::
  map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
  ::map((map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
         *)0x1d3de7);
  std::
  map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
  ::map((map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
         *)0x1d3e03);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
                   *)0x1d3e1f);
  std::
  map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
  ::map((map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
         *)0x1d3e3b);
  std::
  map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
  ::map((map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
         *)0x1d3e57);
  std::
  map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
  ::map((map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
         *)0x1d3e73);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1d3e8f);
  std::__cxx11::list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::
  list((list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_> *)0x1d3eab);
  std::
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
  ::map((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MetricsDiscovery::SMetricAggregationData>_>_>_>_>_>
         *)0x1d3ec7);
  std::ofstream::ofstream(in_RDI + 0x1255);
  std::
  map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
  ::map((map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
         *)0x1d3efe);
  __k = (key_type *)(in_RDI + 0x129c);
  std::
  map<_cl_context_*,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>_>_>_>
  ::map((map<_cl_context_*,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_std::__cxx11::list<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>_>_>_>
         *)0x1d3f17);
  this_00 = (map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             *)(in_RDI + 0x12a2);
  std::
  map<_cl_event_*,_unsigned_long,_std::less<_cl_event_*>,_std::allocator<std::pair<_cl_event_*const,_unsigned_long>_>_>
  ::map((map<_cl_event_*,_unsigned_long,_std::less<_cl_event_*>,_std::allocator<std::pair<_cl_event_*const,_unsigned_long>_>_>
         *)0x1d3f30);
  std::
  map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
  ::map((map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
         *)0x1d3f49);
  std::
  map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1d3f62);
  std::
  map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
  ::map((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
         *)0x1d3f7b);
  std::
  map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
  ::map((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
         *)0x1d3f94);
  std::
  map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
  ::map((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
         *)0x1d3fad);
  std::
  map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
  ::map((map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
         *)0x1d3fc6);
  std::
  map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
  ::map((map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
         *)0x1d3fe2);
  std::
  map<_cl_kernel_*,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map((map<_cl_kernel_*,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
         *)0x1d3ffe);
  std::
  map<_cl_kernel_*,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ::map((map<_cl_kernel_*,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
         *)0x1d401a);
  std::
  map<_cl_kernel_*,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>_>_>_>
  ::map((map<_cl_kernel_*,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>_>_>_>
         *)0x1d4036);
  std::
  map<_cl_program_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<_cl_program_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1d4052);
  std::
  map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
  ::map((map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
         *)0x1d406e);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1d408a);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1d40a6);
  std::
  map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
  ::map((map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
         *)0x1d40c2);
  std::
  map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
  ::map((map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
         *)0x1d40de);
  std::
  map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
  ::map((map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
         *)0x1d40fa);
  std::
  map<_cl_accelerator_intel_*,__cl_platform_id_*,_std::less<_cl_accelerator_intel_*>,_std::allocator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>_>
  ::map((map<_cl_accelerator_intel_*,__cl_platform_id_*,_std::less<_cl_accelerator_intel_*>,_std::allocator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>_>
         *)0x1d4116);
  std::
  map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
  ::map((map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
         *)0x1d4132);
  std::
  map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
  ::map((map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
         *)0x1d414e);
  std::
  map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
  ::map((map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
         *)0x1d416a);
  std::
  map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
  ::map((map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
         *)0x1d4186);
  std::
  map<_cl_command_buffer_khr_*,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>_>
  ::map((map<_cl_command_buffer_khr_*,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>_>
         *)0x1d41a2);
  SConfig::SConfig((SConfig *)in_stack_fffffffffffff750);
  std::
  map<_cl_context_*,_CLIntercept::SUSMContextInfo,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SUSMContextInfo>_>_>
  ::map((map<_cl_context_*,_CLIntercept::SUSMContextInfo,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SUSMContextInfo>_>_>
         *)0x1d41da);
  std::
  map<_cl_kernel_*,_CLIntercept::SUSMKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SUSMKernelInfo>_>_>
  ::map((map<_cl_kernel_*,_CLIntercept::SUSMKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SUSMKernelInfo>_>_>
         *)0x1d41f6);
  uVar1 = ::OS::Services_Common::GetProcessID((Services_Common *)0x1d4207);
  *in_RDI = uVar1;
  memset(local_4e8,0,0x4a8);
  memcpy(in_RDI + 7,local_4e8,0x4a8);
  memset(local_6f8,0,0x210);
  __dest = std::
           map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
           ::operator[](this_00,__k);
  memcpy(__dest,local_6f8,0x210);
  in_RDI[0x182] = 0;
  *(undefined1 *)(in_RDI + 0x120e) = 0;
  puVar2 = in_RDI + 0x120f;
  local_10 = 0;
  local_14 = 0;
  local_8 = puVar2;
  local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_20 = local_10;
  if (local_14 == 3) {
    *puVar2 = local_10;
  }
  else if (local_14 == 5) {
    LOCK();
    *puVar2 = local_10;
    UNLOCK();
  }
  else {
    *puVar2 = local_10;
  }
  *(undefined4 *)(in_RDI + 0x121d) = 0;
  *(undefined4 *)((long)in_RDI + 0x90ec) = 0;
  *(undefined4 *)(in_RDI + 0x1243) = 0;
  in_RDI[0x124e] = 0;
  *(undefined4 *)(in_RDI + 0x1295) = 0;
  *(undefined4 *)(in_RDI + 0x12a8) = 0;
  *(undefined4 *)(in_RDI + 0x12f1) = 0;
  *(undefined4 *)((long)in_RDI + 0x978c) = 0;
  *(undefined1 *)(in_RDI + 0x12f8) = 0;
  *(undefined4 *)((long)in_RDI + 0x97c4) = 0;
  *(undefined4 *)(in_RDI + 0x12f9) = 0;
  *(undefined4 *)(in_RDI + 0x131e) = 0;
  *(undefined1 *)(in_RDI + 0x1337) = 0;
  *(undefined1 *)((long)in_RDI + 0x99b9) = 0;
  *(undefined1 *)((long)in_RDI + 0x99ba) = 0;
  *(undefined1 *)((long)in_RDI + 0x99bb) = 0;
  *(undefined4 *)((long)in_RDI + 0x99bc) = 0;
  *(undefined1 *)(in_RDI + 0x1338) = 0;
  *(undefined1 *)((long)in_RDI + 0x99c1) = 0;
  *(undefined1 *)((long)in_RDI + 0x99c2) = 0;
  *(undefined1 *)((long)in_RDI + 0x99c3) = 0;
  *(undefined1 *)((long)in_RDI + 0x99c4) = 0;
  *(undefined1 *)((long)in_RDI + 0x99c5) = 0;
  *(undefined1 *)((long)in_RDI + 0x99c6) = 0;
  *(undefined1 *)((long)in_RDI + 0x99c7) = 0;
  *(undefined1 *)(in_RDI + 0x1339) = 0;
  *(undefined4 *)((long)in_RDI + 0x99cc) = 0x4000;
  *(undefined1 *)(in_RDI + 0x133a) = 1;
  *(undefined1 *)((long)in_RDI + 0x99d1) = 0;
  *(undefined1 *)((long)in_RDI + 0x99d2) = 0;
  *(undefined1 *)((long)in_RDI + 0x99d3) = 0;
  *(undefined1 *)((long)in_RDI + 0x99d4) = 0;
  *(undefined1 *)((long)in_RDI + 0x99d5) = 0;
  *(undefined4 *)(in_RDI + 0x133b) = 0;
  *(undefined1 *)((long)in_RDI + 0x99dc) = 0;
  *(undefined1 *)((long)in_RDI + 0x99dd) = 0;
  *(undefined1 *)((long)in_RDI + 0x99de) = 0;
  *(undefined1 *)((long)in_RDI + 0x99df) = 0;
  *(undefined1 *)(in_RDI + 0x133c) = 0;
  *(undefined1 *)((long)in_RDI + 0x99e1) = 0;
  *(undefined1 *)((long)in_RDI + 0x99e2) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x133d),"");
  *(undefined1 *)(in_RDI + 0x1341) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a09) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a0a) = 0;
  *(undefined4 *)((long)in_RDI + 0x9a0c) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x1342) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a11) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a12) = 1;
  *(undefined4 *)((long)in_RDI + 0x9a14) = 0;
  *(undefined1 *)(in_RDI + 0x1343) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a19) = 1;
  *(undefined1 *)((long)in_RDI + 0x9a1a) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a1b) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a1c) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a1d) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a1e) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a1f) = 0;
  *(undefined1 *)(in_RDI + 0x1344) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a21) = 0;
  *(undefined4 *)((long)in_RDI + 0x9a24) = 0;
  *(undefined4 *)(in_RDI + 0x1345) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x9a2c) = 0;
  *(undefined4 *)(in_RDI + 0x1346) = 0xffffffff;
  *(undefined1 *)((long)in_RDI + 0x9a34) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a35) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a36) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1347),"");
  *(undefined1 *)(in_RDI + 0x134b) = 0;
  *(undefined1 *)((long)in_RDI + 0x9a59) = 0;
  *(undefined4 *)((long)in_RDI + 0x9a5c) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x134c),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1350),"");
  *(undefined1 *)(in_RDI + 0x1354) = 0;
  *(undefined1 *)((long)in_RDI + 0x9aa1) = 0;
  *(undefined4 *)((long)in_RDI + 0x9aa4) = 1000;
  *(undefined4 *)(in_RDI + 0x1355) = 0;
  *(undefined1 *)((long)in_RDI + 0x9aac) = 0;
  *(undefined1 *)((long)in_RDI + 0x9aad) = 0;
  *(undefined1 *)((long)in_RDI + 0x9aae) = 0;
  *(undefined1 *)((long)in_RDI + 0x9aaf) = 0;
  *(undefined1 *)(in_RDI + 0x1356) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab1) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab2) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab3) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab4) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab5) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab6) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab7) = 0;
  *(undefined1 *)(in_RDI + 0x1357) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ab9) = 0;
  *(undefined1 *)((long)in_RDI + 0x9aba) = 0;
  *(undefined1 *)((long)in_RDI + 0x9abb) = 0;
  *(undefined1 *)((long)in_RDI + 0x9abc) = 0;
  *(undefined1 *)((long)in_RDI + 0x9abd) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1358),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x135c),"");
  *(undefined1 *)(in_RDI + 0x1360) = 0;
  *(undefined1 *)((long)in_RDI + 0x9b01) = 0;
  *(undefined1 *)((long)in_RDI + 0x9b02) = 0;
  *(undefined1 *)((long)in_RDI + 0x9b03) = 0;
  *(undefined1 *)((long)in_RDI + 0x9b04) = 0;
  *(undefined1 *)((long)in_RDI + 0x9b05) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1361),"clang");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1365),"opencl.h");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1369),"spirv-dis");
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x136d),
             "-cc1 -x cl -cl-std=CL1.2 -D__OPENCL_C_VERSION__=120 -D__OPENCL_VERSION__=120 -emit-spirv -triple=spir"
            );
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x1371),
             "-cc1 -x cl -cl-std=CL2.0 -D__OPENCL_C_VERSION__=200 -D__OPENCL_VERSION__=200 -emit-spirv -triple=spir"
            );
  *(undefined1 *)(in_RDI + 0x1375) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ba9) = 0;
  *(undefined1 *)((long)in_RDI + 0x9baa) = 0;
  *(undefined1 *)((long)in_RDI + 0x9bab) = 0;
  *(undefined1 *)((long)in_RDI + 0x9bac) = 0;
  *(undefined1 *)((long)in_RDI + 0x9bad) = 0;
  *(undefined1 *)((long)in_RDI + 0x9bae) = 0;
  *(undefined1 *)((long)in_RDI + 0x9baf) = 0;
  *(undefined1 *)(in_RDI + 0x1376) = 0;
  *(undefined1 *)((long)in_RDI + 0x9bb1) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1377),"");
  *(undefined1 *)(in_RDI + 0x137b) = 0;
  *(undefined1 *)((long)in_RDI + 0x9bd9) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x137c),"");
  *(undefined4 *)(in_RDI + 0x1380) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c04) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1381) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c0c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1382) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c14) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x1383) = 0;
  *(undefined1 *)((long)in_RDI + 0x9c19) = 0;
  *(undefined1 *)((long)in_RDI + 0x9c1a) = 0;
  *(undefined1 *)((long)in_RDI + 0x9c1b) = 0;
  *(undefined1 *)((long)in_RDI + 0x9c1c) = 0;
  *(undefined1 *)((long)in_RDI + 0x9c1d) = 1;
  *(undefined4 *)(in_RDI + 0x1384) = 1;
  *(undefined1 *)((long)in_RDI + 0x9c24) = 0;
  *(undefined4 *)(in_RDI + 0x1385) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c2c) = 0xffffffff;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1386),"");
  *(undefined1 *)(in_RDI + 0x138a) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c54) = 0;
  *(undefined4 *)(in_RDI + 0x138b) = 0xffffffff;
  *(undefined1 *)((long)in_RDI + 0x9c5c) = 0;
  *(undefined1 *)((long)in_RDI + 0x9c5d) = 0;
  *(undefined1 *)((long)in_RDI + 0x9c5e) = 0;
  *(undefined4 *)(in_RDI + 0x138c) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c64) = 0xffffffff;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x138d),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1391),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1395),"");
  *(undefined1 *)(in_RDI + 0x1399) = 0;
  *(undefined4 *)((long)in_RDI + 0x9ccc) = 0;
  *(undefined4 *)(in_RDI + 0x139a) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x9cd4) = 0;
  *(undefined4 *)(in_RDI + 0x139b) = 0;
  *(undefined1 *)((long)in_RDI + 0x9cdc) = 0;
  in_RDI[0x139c] = 0;
  *(undefined1 *)(in_RDI + 0x139d) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ce9) = 0;
  *(undefined1 *)((long)in_RDI + 0x9cea) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ceb) = 0;
  *(undefined1 *)((long)in_RDI + 0x9cec) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ced) = 0;
  *(undefined1 *)((long)in_RDI + 0x9cee) = 0;
  *(undefined1 *)((long)in_RDI + 0x9cef) = 0;
  *(undefined1 *)(in_RDI + 0x139e) = 0;
  in_RDI[0x139f] = 0;
  in_RDI[0x13a0] = 0;
  in_RDI[0x13a1] = 0;
  *(undefined1 *)(in_RDI + 0x13a2) = 0;
  *(undefined4 *)((long)in_RDI + 0x9d14) = 0;
  *(undefined4 *)(in_RDI + 0x13a3) = 0;
  *(undefined1 *)((long)in_RDI + 0x9d1c) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13a4),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13a8),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13ac),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13b0),"");
  *(undefined4 *)(in_RDI + 0x13b4) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x9da4) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13b5),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13b9),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13bd),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13c1),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13c5),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13c9),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13cd),"");
  *(undefined4 *)(in_RDI + 0x13d1) = 0;
  *(undefined4 *)((long)in_RDI + 0x9e8c) = 0;
  *(undefined4 *)(in_RDI + 0x13d2) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x9e94) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x13d3) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x9e9c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x13d4) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x9ea4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x13d5) = 0xffffffff;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13d6),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x13da),"");
  *(undefined1 *)(in_RDI + 0x13de) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ef1) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ef2) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ef3) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ef4) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ef5) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ef6) = 0;
  *(undefined1 *)((long)in_RDI + 0x9ef7) = 0;
  return;
}

Assistant:

CLIntercept::CLIntercept( void* pGlobalData )
    : m_OS( pGlobalData )
{
    m_ProcessId = m_OS.GetProcessID();

    m_Dispatch = {0};
    m_DispatchX[NULL] = {0};

    m_OpenCLLibraryHandle = NULL;

    m_LoggedCLInfo = false;

    m_EnqueueCounter.store(0, std::memory_order::memory_order_relaxed);

    m_EventsChromeTraced = 0;
    m_ProgramNumber = 0;
    m_KernelID = 0;

#if defined(USE_MDAPI)
    m_pMDHelper = NULL;
#endif

    m_QueueNumber = 0;
    m_MemAllocNumber = 0;

    m_CaptureReplayKernelEnqueueSkipCounter = 0;
    m_CaptureReplayKernelEnqueueCaptureCounter = 0;

    m_AubCaptureStarted = false;
    m_AubCaptureKernelEnqueueSkipCounter = 0;
    m_AubCaptureKernelEnqueueCaptureCounter = 0;

    m_CommandBufferNumber = 0;

#define CLI_CONTROL( _type, _name, _init, _desc )   m_Config . _name = _init;
#include "controls.h"
#undef CLI_CONTROL

#if defined(USE_ITT)
    m_ITTInitialized = false;

    m_ITTDomain = NULL;

    //m_ITTQueuedState = NULL;
    //m_ITTSubmittedState = NULL;
    //m_ITTExecutingState = NULL;

    //m_ITTQueueTrackGroup = NULL;
#endif
}